

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::load(Interpreter *this)

{
  ulong uVar1;
  void *__dest;
  void *__src;
  mapped_type *pmVar2;
  Call local_80;
  opFunc local_68;
  opFunc f;
  void *local_58;
  void *dataMem;
  unsigned_long size;
  string local_38 [8];
  string str;
  key_type local_15 [5];
  uint8_t opcode;
  Interpreter *pIStack_10;
  uint curOp;
  Interpreter *this_local;
  
  local_15[1] = '\0';
  local_15[2] = '\0';
  local_15[3] = '\0';
  local_15[4] = '\0';
  pIStack_10 = this;
  while( true ) {
    std::istream::read((char *)this->s,(long)local_15);
    uVar1 = std::ios::good();
    if ((uVar1 & 1) == 0) break;
    std::__cxx11::string::string(local_38);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)this->s,local_38);
    dataMem = (void *)std::__cxx11::string::size();
    __dest = malloc((size_t)dataMem);
    local_58 = __dest;
    __src = (void *)std::__cxx11::string::data();
    memcpy(__dest,__src,(size_t)dataMem);
    pmVar2 = std::
             map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
             ::operator[](&this->operations,local_15);
    local_68 = *pmVar2;
    f = pmVar2[1];
    Call::Call(&local_80,local_68,(void *)f);
    std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::push_back
              (&this->callList,&local_80);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Interpreter::load() {
    //load labels
    unsigned int curOp = 0;
/*    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

        if (opcode == op::LABEL) {
#ifdef I_DEBUG
            printf("loaded label: %i pointing to op#%i\n", *str.data(), curOp);
#endif
            labels[*(unsigned int *) str.data()] = curOp;
            continue;
        }

        curOp++;
    }
    s->clear();
    s->seekg(0, std::ios::beg);

    curOp = 0;*/
    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

/*        if (opcode == op::LABEL) {
*//*#ifdef I_DEBUG
            printf("loaded label: %i\n", *str.data());
#endif
            labels[*str.data()] = curOp;*//*
            continue;
        }*/

        unsigned long size = str.size() * sizeof(str[0]);
        void *dataMem = malloc(size);
        memcpy(dataMem, str.data(), size);
#ifdef I_DEBUG
        printf("loaded %i; data size: %i\n", opcode, (int) size);
#endif
        opFunc f = operations[opcode];
        callList.push_back(Call(f, dataMem));
    }
}